

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

char * match(MatchState *ms,char *s,char *p)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ushort **ppuVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  ptrdiff_t *ppVar10;
  lua_State *L;
  byte *s_00;
  bool bVar11;
  int iStack_40;
  
LAB_00110b1d:
  s_00 = (byte *)s + 1;
  pcVar7 = p;
LAB_00110b24:
  switch(*pcVar7) {
  case '$':
    if (pcVar7[1] == '\0') {
      if (s == ms->src_end) {
        return (char *)(byte *)s;
      }
      return (char *)0x0;
    }
    break;
  case '%':
    bVar1 = pcVar7[1];
    if ((ulong)bVar1 == 0x66) {
      if (pcVar7[2] == '[') goto code_r0x00110b5d;
      L = ms->L;
      pcVar7 = "missing \'[\' after \'%%f\' in pattern";
      goto LAB_00110e7a;
    }
    if (bVar1 == 0x62) {
      bVar1 = pcVar7[2];
      if ((bVar1 == 0) || (pcVar7[3] == 0)) {
        L = ms->L;
        pcVar7 = "unbalanced pattern";
        goto LAB_00110e7a;
      }
      if (*s != bVar1) {
        return (char *)0x0;
      }
      iVar4 = 1;
      goto LAB_00110c6b;
    }
    ppuVar6 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar6 + (ulong)bVar1 * 2 + 1) & 8) == 0) break;
    if ((0x30 < bVar1) && (uVar5 = bVar1 - 0x31, (int)uVar5 < ms->level)) {
      uVar8 = ms->capture[uVar5].len;
      if (uVar8 != 0xffffffffffffffff) {
        if ((ulong)((long)ms->src_end - (long)s) < uVar8) {
          return (char *)0x0;
        }
        iVar4 = bcmp(ms->capture[uVar5].init,s,uVar8);
        if (iVar4 != 0) {
          return (char *)0x0;
        }
        if ((byte *)s == (byte *)0x0) {
          return (char *)0x0;
        }
        s = (char *)((byte *)s + uVar8);
        p = pcVar7 + 2;
        goto LAB_00110b1d;
      }
    }
    L = ms->L;
    pcVar7 = "invalid capture index";
    goto LAB_00110e7a;
  case '&':
  case '\'':
    break;
  case '(':
    if (pcVar7[1] == ')') {
      pcVar7 = pcVar7 + 2;
      iStack_40 = -2;
    }
    else {
      pcVar7 = pcVar7 + 1;
      iStack_40 = -1;
    }
    pcVar7 = start_capture(ms,s,pcVar7,iStack_40);
    return pcVar7;
  case ')':
    uVar8 = (ulong)(uint)ms->level;
    ppVar10 = &ms->capture[uVar8 - 1].len;
    while (0 < (int)uVar8) {
      uVar8 = uVar8 - 1;
      lVar3 = *ppVar10;
      ppVar10 = ppVar10 + -2;
      if (lVar3 == -1) {
        uVar8 = uVar8 & 0xffffffff;
        ms->capture[uVar8].len = (long)s - (long)ms->capture[uVar8].init;
        pcVar7 = match(ms,s,pcVar7 + 1);
        if (pcVar7 == (char *)0x0) {
          ms->capture[uVar8].len = -1;
          return (char *)0x0;
        }
        return pcVar7;
      }
    }
    L = ms->L;
    pcVar7 = "invalid pattern capture";
LAB_00110e7a:
    luaL_error(L,pcVar7);
  default:
    if (*pcVar7 == '\0') {
      return (char *)(byte *)s;
    }
  }
  p = classend(ms,pcVar7);
  if (s < ms->src_end) {
    iVar4 = singlematch((uint)(byte)*s,pcVar7,p);
    bVar11 = iVar4 != 0;
  }
  else {
    bVar11 = false;
  }
  cVar2 = *p;
  if (cVar2 == '?') {
    if ((bVar11) && (pcVar7 = match(ms,(char *)s_00,p + 1), pcVar7 != (char *)0x0)) {
      return pcVar7;
    }
    pcVar7 = p + 1;
    goto LAB_00110b24;
  }
  if (cVar2 != '*') {
    if (cVar2 != '+') {
      if (cVar2 == '-') {
        while( true ) {
          pcVar9 = match(ms,s,p + 1);
          if (pcVar9 != (char *)0x0) {
            return pcVar9;
          }
          if (ms->src_end <= s) break;
          iVar4 = singlematch((uint)(byte)*s,pcVar7,p);
          s = (char *)((byte *)s + 1);
          if (iVar4 == 0) {
            return (char *)0x0;
          }
        }
        return (char *)0x0;
      }
      if (!bVar11) {
        return (char *)0x0;
      }
      s = (char *)((byte *)s + 1);
      goto LAB_00110b1d;
    }
    if (!bVar11) {
      return (char *)0x0;
    }
    s = (char *)((byte *)s + 1);
  }
  pcVar7 = max_expand(ms,s,pcVar7,p);
  return pcVar7;
code_r0x00110b5d:
  pcVar9 = pcVar7 + 2;
  pcVar7 = classend(ms,pcVar9);
  if (s == ms->src_init) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)((byte *)s)[-1];
  }
  iVar4 = matchbracketclass(uVar5,pcVar9,pcVar7 + -1);
  if (iVar4 != 0) {
    return (char *)0x0;
  }
  iVar4 = matchbracketclass((uint)(byte)*s,pcVar9,pcVar7 + -1);
  if (iVar4 == 0) {
    return (char *)0x0;
  }
  goto LAB_00110b24;
LAB_00110c6b:
  if (ms->src_end <= s_00) {
    return (char *)0x0;
  }
  if (*s_00 == pcVar7[3]) {
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) goto LAB_00110cc0;
  }
  else {
    iVar4 = iVar4 + (uint)(*s_00 == bVar1);
  }
  s_00 = s_00 + 1;
  goto LAB_00110c6b;
LAB_00110cc0:
  s = (char *)(s_00 + 1);
  p = pcVar7 + 4;
  goto LAB_00110b1d;
}

Assistant:

static const char*match(MatchState*ms,const char*s,const char*p){
init:
switch(*p){
case'(':{
if(*(p+1)==')')
return start_capture(ms,s,p+2,(-2));
else
return start_capture(ms,s,p+1,(-1));
}
case')':{
return end_capture(ms,s,p+1);
}
case'%':{
switch(*(p+1)){
case'b':{
s=matchbalance(ms,s,p+2);
if(s==NULL)return NULL;
p+=4;goto init;
}
case'f':{
const char*ep;char previous;
p+=2;
if(*p!='[')
luaL_error(ms->L,"missing "LUA_QL("[")" after "
LUA_QL("%%f")" in pattern");
ep=classend(ms,p);
previous=(s==ms->src_init)?'\0':*(s-1);
if(matchbracketclass(uchar(previous),p,ep-1)||
!matchbracketclass(uchar(*s),p,ep-1))return NULL;
p=ep;goto init;
}
default:{
if(isdigit(uchar(*(p+1)))){
s=match_capture(ms,s,uchar(*(p+1)));
if(s==NULL)return NULL;
p+=2;goto init;
}
goto dflt;
}
}
}
case'\0':{
return s;
}
case'$':{
if(*(p+1)=='\0')
return(s==ms->src_end)?s:NULL;
else goto dflt;
}
default:dflt:{
const char*ep=classend(ms,p);
int m=s<ms->src_end&&singlematch(uchar(*s),p,ep);
switch(*ep){
case'?':{
const char*res;
if(m&&((res=match(ms,s+1,ep+1))!=NULL))
return res;
p=ep+1;goto init;
}
case'*':{
return max_expand(ms,s,p,ep);
}
case'+':{
return(m?max_expand(ms,s+1,p,ep):NULL);
}
case'-':{
return min_expand(ms,s,p,ep);
}
default:{
if(!m)return NULL;
s++;p=ep;goto init;
}
}
}
}
}